

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BuildStatus *pBVar1;
  BindingEnv *pBVar2;
  DiskInterface *pDVar3;
  Metrics *this_01;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Node **ppNVar7;
  Node **ppNVar8;
  reference ppNVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BuildLog *pBVar10;
  int *piVar11;
  char *pcVar12;
  size_type sVar13;
  reference ppNVar14;
  string *psVar15;
  undefined4 extraout_var_02;
  DepsLog *this_02;
  Metric *local_358;
  allocator<char> local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  TimeStamp local_2e8;
  TimeStamp deps_mtime;
  Node *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  undefined1 local_250 [8];
  string rspfile;
  TimeStamp depfile_mtime;
  string local_208;
  undefined1 local_1e8 [8];
  string depfile;
  TimeStamp input_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1b8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1b0;
  iterator i;
  TimeStamp restat_mtime;
  TimeStamp new_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_190;
  iterator o;
  undefined1 local_180 [6];
  bool node_cleaned;
  byte local_159;
  Node **ppNStack_158;
  bool restat;
  TimeStamp output_mtime;
  int local_148;
  int local_144;
  int end_time;
  int start_time;
  string extract_err;
  string local_118;
  undefined1 local_f8 [8];
  string deps_prefix;
  string local_d0;
  undefined1 local_b0 [8];
  string deps_type;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  Edge *edge;
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  Result *result_local;
  Builder *this_local;
  undefined4 extraout_var;
  
  local_28 = err;
  err_local = (string *)result;
  result_local = (Result *)this;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar5 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_01 = g_metrics, iVar5 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      local_358 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"FinishCommand",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      local_358 = Metrics::NewMetric(this_01,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    FinishCommand::metrics_h_metric = local_358;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&edge,FinishCommand::metrics_h_metric);
  this_00 = *(Edge **)err_local;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"deps",(allocator<char> *)(deps_prefix.field_2._M_local_buf + 0xf))
  ;
  Edge::GetBinding((string *)local_b0,this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(deps_prefix.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"msvc_deps_prefix",
             (allocator<char> *)(extract_err.field_2._M_local_buf + 0xf));
  Edge::GetBinding((string *)local_f8,this_00,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(extract_err.field_2._M_local_buf + 0xf));
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::string((string *)&end_time);
    bVar4 = ExtractDeps(this,(Result *)err_local,(string *)local_b0,(string *)local_f8,
                        (vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8),
                        (string *)&end_time);
    if ((!bVar4) && (bVar4 = CommandRunner::Result::success((Result *)err_local), bVar4)) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::append((err_local->field_2)._M_local_buf);
      }
      std::__cxx11::string::append((string *)(err_local->field_2)._M_local_buf);
      *(undefined4 *)&err_local->_M_string_length = 1;
    }
    std::__cxx11::string::~string((string *)&end_time);
  }
  pBVar1 = this->status_;
  bVar4 = CommandRunner::Result::success((Result *)err_local);
  BuildStatus::BuildEdgeFinished
            (pBVar1,this_00,bVar4,(string *)&err_local->field_2,&local_144,&local_148);
  bVar4 = CommandRunner::Result::success((Result *)err_local);
  if (!bVar4) {
    this_local._7_1_ = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_28);
    output_mtime._4_4_ = 1;
    goto LAB_0011b61a;
  }
  ppNStack_158 = (Node **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_180,"restat",(allocator<char> *)((long)&o._M_current + 7));
  bVar4 = Edge::GetBindingBool(this_00,(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&o._M_current + 7));
  local_159 = bVar4;
  if ((this->config_->dry_run & 1U) == 0) {
    o._M_current._6_1_ = 0;
    local_190._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this_00->outputs_);
    while( true ) {
      new_mtime = (TimeStamp)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this_00->outputs_);
      bVar4 = __gnu_cxx::operator!=
                        (&local_190,
                         (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&new_mtime);
      if (!bVar4) break;
      pDVar3 = this->disk_interface_;
      ppNVar9 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_190);
      psVar15 = Node::path_abi_cxx11_(*ppNVar9);
      iVar5 = (*(pDVar3->super_FileReader)._vptr_FileReader[5])(pDVar3,psVar15,local_28);
      ppNVar7 = (Node **)CONCAT44(extraout_var,iVar5);
      if (ppNVar7 == (Node **)0xffffffffffffffff) {
        this_local._7_1_ = 0;
        output_mtime._4_4_ = 1;
        goto LAB_0011b61a;
      }
      if ((long)ppNStack_158 < (long)ppNVar7) {
        ppNStack_158 = ppNVar7;
      }
      ppNVar9 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_190);
      ppNVar8 = (Node **)Node::mtime(*ppNVar9);
      if ((ppNVar8 == ppNVar7) && ((local_159 & 1) != 0)) {
        ppNVar9 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_190);
        bVar4 = Plan::CleanNode(&this->plan_,&this->scan_,*ppNVar9,local_28);
        if (!bVar4) {
          this_local._7_1_ = 0;
          output_mtime._4_4_ = 1;
          goto LAB_0011b61a;
        }
        o._M_current._6_1_ = 1;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_190);
    }
    if ((o._M_current._6_1_ & 1) != 0) {
      i._M_current = (Node **)0x0;
      local_1b0._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this_00->inputs_);
      while( true ) {
        input_mtime = (TimeStamp)
                      std::vector<Node_*,_std::allocator<Node_*>_>::end(&this_00->inputs_);
        local_1b8 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator-((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                               *)&input_mtime,(long)this_00->order_only_deps_);
        bVar4 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
        if (!bVar4) break;
        pDVar3 = this->disk_interface_;
        ppNVar9 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_1b0);
        psVar15 = Node::path_abi_cxx11_(*ppNVar9);
        iVar5 = (*(pDVar3->super_FileReader)._vptr_FileReader[5])(pDVar3,psVar15,local_28);
        depfile.field_2._8_8_ = CONCAT44(extraout_var_00,iVar5);
        if ((Node **)depfile.field_2._8_8_ == (Node **)0xffffffffffffffff) {
          this_local._7_1_ = 0;
          output_mtime._4_4_ = 1;
          goto LAB_0011b61a;
        }
        if ((long)i._M_current < (long)depfile.field_2._8_8_) {
          i._M_current = (Node **)depfile.field_2._8_8_;
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_1b0);
      }
      Edge::GetUnescapedDepfile_abi_cxx11_((string *)local_1e8,this_00);
      if (((i._M_current == (Node **)0x0) ||
          (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) ||
         (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
LAB_0011b09e:
        pBVar1 = this->status_;
        iVar5 = Plan::command_edge_count(&this->plan_);
        BuildStatus::PlanHasTotalEdges(pBVar1,iVar5);
        ppNStack_158 = i._M_current;
        output_mtime._4_4_ = 0;
      }
      else {
        pBVar2 = this_00->env_;
        std::__cxx11::string::string((string *)&depfile_mtime,(string *)local_1e8);
        RelPathEnv::ApplyChdir(&local_208,&pBVar2->super_RelPathEnv,(string *)&depfile_mtime);
        std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&depfile_mtime);
        iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                          (this->disk_interface_,(string *)local_1e8,local_28);
        rspfile.field_2._8_8_ = CONCAT44(extraout_var_01,iVar5);
        if ((Node **)rspfile.field_2._8_8_ != (Node **)0xffffffffffffffff) {
          if ((long)i._M_current < (long)rspfile.field_2._8_8_) {
            i._M_current = (Node **)rspfile.field_2._8_8_;
          }
          goto LAB_0011b09e;
        }
        this_local._7_1_ = 0;
        output_mtime._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_1e8);
      if (output_mtime._4_4_ != 0) goto LAB_0011b61a;
    }
  }
  bVar4 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_28);
  if (!bVar4) {
    this_local._7_1_ = 0;
    output_mtime._4_4_ = 1;
    goto LAB_0011b61a;
  }
  Edge::GetUnescapedRspfile_abi_cxx11_((string *)local_250,this_00);
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) == 0) && ((g_keep_rsp & 1U) == 0)) {
    pBVar2 = this_00->env_;
    std::__cxx11::string::string((string *)&local_290,(string *)local_250);
    RelPathEnv::ApplyChdir(&local_270,&pBVar2->super_RelPathEnv,&local_290);
    std::__cxx11::string::operator=((string *)local_250,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    (*(this->disk_interface_->super_FileReader)._vptr_FileReader[8])
              (this->disk_interface_,(string *)local_250);
  }
  pBVar10 = DependencyScan::build_log(&this->scan_);
  if (pBVar10 == (BuildLog *)0x0) {
LAB_0011b3b9:
    uVar6 = std::__cxx11::string::empty();
    if (((uVar6 & 1) == 0) && ((this->config_->dry_run & 1U) == 0)) {
      sVar13 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&this_00->outputs_);
      if (sVar13 != 1) {
        __assert_fail("edge->outputs_.size() == 1 && \"should have been rejected by parser\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build.cc"
                      ,0x41e,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
      }
      ppNVar14 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&this_00->outputs_,0);
      deps_mtime = (TimeStamp)*ppNVar14;
      pDVar3 = this->disk_interface_;
      psVar15 = Node::path_abi_cxx11_((Node *)deps_mtime);
      iVar5 = (*(pDVar3->super_FileReader)._vptr_FileReader[5])(pDVar3,psVar15,local_28);
      local_2e8 = CONCAT44(extraout_var_02,iVar5);
      if (local_2e8 == -1) {
        this_local._7_1_ = 0;
      }
      else {
        this_02 = DependencyScan::deps_log(&this->scan_);
        bVar4 = DepsLog::RecordDeps(this_02,(Node *)deps_mtime,local_2e8,
                                    (vector<Node_*,_std::allocator<Node_*>_> *)
                                    ((long)&deps_type.field_2 + 8));
        if (bVar4) goto LAB_0011b5f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_328,"Error writing to deps log: ",&local_329);
        piVar11 = __errno_location();
        pcVar12 = strerror(*piVar11);
        std::operator+(&local_308,&local_328,pcVar12);
        std::__cxx11::string::operator=((string *)local_28,(string *)&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator(&local_329);
        this_local._7_1_ = 0;
      }
    }
    else {
LAB_0011b5f0:
      this_local._7_1_ = 1;
    }
  }
  else {
    pBVar10 = DependencyScan::build_log(&this->scan_);
    bVar4 = BuildLog::RecordCommand(pBVar10,this_00,local_144,local_148,(TimeStamp)ppNStack_158);
    if (bVar4) goto LAB_0011b3b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"Error writing to build log: ",
               (allocator<char> *)((long)&out + 7));
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    std::operator+(&local_2b0,&local_2d0,pcVar12);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&out + 7));
    this_local._7_1_ = 0;
  }
  output_mtime._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_250);
LAB_0011b61a:
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_b0);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8));
  ScopedMetric::~ScopedMetric((ScopedMetric *)&edge);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      // The depfile will not have current chdir and must be fixed up.
      // But first detect whether depfile was absent.
      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        // Apply chdir fixup.
        depfile = edge->env_->ApplyChdir(depfile);
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  // The rspfile will not have current chdir and must be fixed up.
  // But first detect whether rspfile was absent.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp) {
    // Apply chdir fixup.
    rspfile = edge->env_->ApplyChdir(rspfile);
    disk_interface_->RemoveFile(rspfile);
  }

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(edge->outputs_.size() == 1 && "should have been rejected by parser");
    Node* out = edge->outputs_[0];
    TimeStamp deps_mtime = disk_interface_->Stat(out->path(), err);
    if (deps_mtime == -1)
      return false;
    if (!scan_.deps_log()->RecordDeps(out, deps_mtime, deps_nodes)) {
      *err = string("Error writing to deps log: ") + strerror(errno);
      return false;
    }
  }
  return true;
}